

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_prefix_coding.h
# Opt level: O3

bool __thiscall
lzham::prefix_coding::decoder_tables::assign(decoder_tables *this,decoder_tables *rhs)

{
  void *pvVar1;
  bool bVar2;
  uint16 *puVar3;
  uint uVar4;
  uint32 *puVar5;
  uint16 **local_38;
  
  bVar2 = true;
  if (this == rhs) {
    return true;
  }
  if (this->m_malloc_context == rhs->m_malloc_context) {
    puVar5 = this->m_lookup;
    puVar3 = this->m_sorted_symbol_order;
    memcpy(this,rhs,200);
    if (puVar3 == (uint16 *)0x0 || puVar5 == (uint32 *)0x0) goto LAB_0011626a;
    uVar4 = rhs->m_cur_lookup_size;
    if ((uVar4 != this->m_cur_lookup_size) ||
       (rhs->m_cur_sorted_symbol_order_size != this->m_cur_sorted_symbol_order_size))
    goto LAB_0011626f;
    this->m_lookup = puVar5;
    this->m_sorted_symbol_order = puVar3;
    memcpy(puVar5,rhs->m_lookup,(ulong)uVar4 << 2);
    puVar3 = this->m_sorted_symbol_order;
LAB_0011636f:
    memcpy(puVar3,rhs->m_sorted_symbol_order,(ulong)this->m_cur_sorted_symbol_order_size * 2);
  }
  else {
    puVar5 = this->m_lookup;
    if (puVar5 != (uint32 *)0x0) {
      if ((puVar5[-2] ^ puVar5[-1]) == 0xffffffff) {
        lzham_free(this->m_malloc_context,puVar5 + -4);
      }
      this->m_lookup = (uint32 *)0x0;
      this->m_cur_lookup_size = 0;
    }
    puVar3 = this->m_sorted_symbol_order;
    if (puVar3 != (uint16 *)0x0) {
      if ((*(uint *)(puVar3 + -4) ^ *(uint *)(puVar3 + -2)) == 0xffffffff) {
        lzham_free(this->m_malloc_context,puVar3 + -8);
      }
      this->m_sorted_symbol_order = (uint16 *)0x0;
      this->m_cur_sorted_symbol_order_size = 0;
    }
    this->m_malloc_context = rhs->m_malloc_context;
    puVar5 = this->m_lookup;
    memcpy(this,rhs,200);
    puVar3 = (uint16 *)0x0;
LAB_0011626a:
    if (puVar5 != (uint32 *)0x0) {
LAB_0011626f:
      if ((puVar5[-2] ^ puVar5[-1]) == 0xffffffff) {
        lzham_free(this->m_malloc_context,puVar5 + -4);
      }
    }
    local_38 = &this->m_sorted_symbol_order;
    this->m_lookup = (uint32 *)0x0;
    if (rhs->m_lookup == (uint32 *)0x0) {
LAB_001162f7:
      if ((puVar3 != (uint16 *)0x0) &&
         ((*(uint *)(puVar3 + -4) ^ *(uint *)(puVar3 + -2)) == 0xffffffff)) {
        lzham_free(this->m_malloc_context,puVar3 + -8);
      }
      *local_38 = (uint16 *)0x0;
      if (rhs->m_sorted_symbol_order == (uint16 *)0x0) {
        return true;
      }
      uVar4 = this->m_cur_sorted_symbol_order_size +
              (uint)(this->m_cur_sorted_symbol_order_size == 0);
      pvVar1 = lzham_malloc(this->m_malloc_context,(ulong)uVar4 * 2 + 0x10,(size_t *)0x0);
      if (pvVar1 != (void *)0x0) {
        puVar3 = (uint16 *)((long)pvVar1 + 0x10);
        *(uint *)((long)pvVar1 + 0xc) = uVar4;
        *(uint *)((long)pvVar1 + 8) = ~uVar4;
        this->m_sorted_symbol_order = puVar3;
        goto LAB_0011636f;
      }
      *local_38 = (uint16 *)0x0;
    }
    else {
      uVar4 = this->m_cur_lookup_size + (uint)(this->m_cur_lookup_size == 0);
      pvVar1 = lzham_malloc(this->m_malloc_context,(ulong)uVar4 * 4 + 0x10,(size_t *)0x0);
      if (pvVar1 != (void *)0x0) {
        *(uint *)((long)pvVar1 + 0xc) = uVar4;
        *(uint *)((long)pvVar1 + 8) = ~uVar4;
        this->m_lookup = (uint32 *)((long)pvVar1 + 0x10);
        memcpy((uint32 *)((long)pvVar1 + 0x10),rhs->m_lookup,(ulong)this->m_cur_lookup_size << 2);
        goto LAB_001162f7;
      }
      this->m_lookup = (uint32 *)0x0;
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

inline bool assign(const decoder_tables& rhs)
         {
            if (this == &rhs)
               return true;

            if (m_malloc_context != rhs.m_malloc_context)
            {
               clear();

               m_malloc_context = rhs.m_malloc_context;
            }

            uint32* pCur_lookup = m_lookup;
            uint16* pCur_sorted_symbol_order = m_sorted_symbol_order;

            memcpy(this, &rhs, sizeof(*this));

            if ((pCur_lookup) && (pCur_sorted_symbol_order) && (rhs.m_cur_lookup_size == m_cur_lookup_size) && (rhs.m_cur_sorted_symbol_order_size == m_cur_sorted_symbol_order_size))
            {
               m_lookup = pCur_lookup;
               m_sorted_symbol_order = pCur_sorted_symbol_order;

               memcpy(m_lookup, rhs.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
               memcpy(m_sorted_symbol_order, rhs.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
            }
            else
            {
               lzham_delete_array(m_malloc_context, pCur_lookup);
               m_lookup = NULL;

               if (rhs.m_lookup)
               {
                  m_lookup = lzham_new_array<uint32>(m_malloc_context, m_cur_lookup_size);
                  if (!m_lookup)
                     return false;
                  memcpy(m_lookup, rhs.m_lookup, sizeof(m_lookup[0]) * m_cur_lookup_size);
               }

               lzham_delete_array(m_malloc_context, pCur_sorted_symbol_order);
               m_sorted_symbol_order = NULL;

               if (rhs.m_sorted_symbol_order)
               {
                  m_sorted_symbol_order = lzham_new_array<uint16>(m_malloc_context, m_cur_sorted_symbol_order_size);
                  if (!m_sorted_symbol_order)
                     return false;
                  memcpy(m_sorted_symbol_order, rhs.m_sorted_symbol_order, sizeof(m_sorted_symbol_order[0]) * m_cur_sorted_symbol_order_size);
               }
            }

            return true;
         }